

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

player_race * get_player_race(void)

{
  byte bVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  player_race **pppVar6;
  ulong uVar7;
  player_race *ppVar8;
  bool bVar9;
  
  ppVar8 = races;
  pppVar6 = &races;
  bVar1 = player->themed_level;
  wVar2 = themed_level_index("Estolad");
  if ((wVar2 == (uint)bVar1) && (uVar3 = Rand_div(2), ppVar8 != (player_race *)0x0)) {
    bVar9 = uVar3 == 0;
    do {
      iVar4 = strcmp(ppVar8->hometown,"Ephel Brandir Town");
      if ((iVar4 == 0) && (bVar9)) {
        return ppVar8;
      }
      bVar9 = (bool)(bVar9 | iVar4 == 0);
      ppVar8 = ppVar8->next;
    } while (ppVar8 != (player_race *)0x0);
  }
  uVar3 = Rand_div(race_prob[(ulong)z_info->p_race_max - 1][player->place]);
  uVar5 = (ulong)z_info->p_race_max;
  if (z_info->p_race_max == 0) {
    uVar5 = 0;
  }
  else {
    uVar7 = 0;
    do {
      if ((int)uVar3 < race_prob[uVar7][player->place]) {
        uVar5 = uVar7 & 0xffffffff;
        break;
      }
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  do {
    pppVar6 = &((player_race *)pppVar6)->next->next;
    iVar4 = (int)uVar5;
    uVar5 = (ulong)(iVar4 - 1);
    if ((player_race *)pppVar6 == (player_race *)0x0) {
      return (player_race *)0x0;
    }
  } while (iVar4 != 0);
  return (player_race *)pppVar6;
}

Assistant:

struct player_race *get_player_race(void)
{
	struct player_race *p_race = races;
	int i, k;

	/* Special case -  Estolad themed level - Edain or Druedain */
	if (player->themed_level == themed_level_index("Estolad")) {
		/* Pick one of the races from Sphel Brandir */
		bool pick = (one_in_(2) ? true : false);
		while (p_race) {
			if (streq(p_race->hometown, "Ephel Brandir Town")) {
				if (pick) {
					return p_race;
				} else {
					pick = true;
				}
			}
			p_race = p_race->next;
		}
	}

	/* Pick one according to the probablilities */
	k = randint0(race_prob[z_info->p_race_max - 1][player->place]);
	for (i = 0; i < z_info->p_race_max; i++) {
		if (race_prob[i][player->place] > k) break;
	}

	/* Find the actual race */
	for (p_race = races; p_race; p_race = p_race->next) {
		if (i == 0) break;
		i--;
	}
	return p_race;
}